

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O0

int access_monster_buffer(void *buffer)

{
  uint8_t uVar1;
  MyGame_Sample_Equipment_union_type_t MVar2;
  int16_t iVar3;
  int16_t iVar4;
  int iVar5;
  int iVar6;
  MyGame_Sample_Monster_table_t t__tmp;
  flatbuffers_string_t pcVar7;
  size_t sVar8;
  MyGame_Sample_Vec3_struct_t t__tmp_00;
  flatbuffers_uint8_vec_t vec__tmp;
  MyGame_Sample_Weapon_vec_t vec;
  MyGame_Sample_Weapon_table_t pMVar9;
  float fVar10;
  int16_t weapon_damage;
  char *weapon_name;
  MyGame_Sample_Weapon_table_t weapon;
  int16_t second_weapon_damage;
  char *second_weapon_name;
  size_t weapons_len;
  MyGame_Sample_Weapon_vec_t weapons;
  uint8_t third_item;
  size_t inv_len;
  flatbuffers_uint8_vec_t inv;
  MyGame_Sample_Vec3_t pos_vec;
  float z;
  float y;
  float x;
  MyGame_Sample_Vec3_struct_t pos;
  int mana_present;
  int hp_present;
  size_t name_len;
  flatbuffers_string_t name;
  int16_t mana;
  int16_t hp;
  MyGame_Sample_Monster_table_t monster;
  void *buffer_local;
  
  t__tmp = MyGame_Sample_Monster_as_root(buffer);
  if (t__tmp == (MyGame_Sample_Monster_table_t)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xd3,"int access_monster_buffer(const void *)");
  }
  iVar3 = MyGame_Sample_Monster_hp(t__tmp);
  iVar4 = MyGame_Sample_Monster_mana(t__tmp);
  pcVar7 = MyGame_Sample_Monster_name(t__tmp);
  sVar8 = flatbuffers_string_len(pcVar7);
  if (iVar3 != 300) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xdb,"int access_monster_buffer(const void *)");
  }
  if (iVar4 != 0x96) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xdd,"int access_monster_buffer(const void *)");
  }
  iVar5 = strcmp(pcVar7,"Orc");
  if (iVar5 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xde,"int access_monster_buffer(const void *)");
  }
  if (sVar8 != 3) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xdf,"int access_monster_buffer(const void *)");
  }
  iVar5 = MyGame_Sample_Monster_hp_is_present(t__tmp);
  iVar6 = MyGame_Sample_Monster_mana_is_present(t__tmp);
  if (iVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xe3,"int access_monster_buffer(const void *)");
  }
  if (iVar6 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xe4,"int access_monster_buffer(const void *)");
  }
  t__tmp_00 = MyGame_Sample_Monster_pos(t__tmp);
  if (t__tmp_00 == (MyGame_Sample_Vec3_struct_t)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xe8,"int access_monster_buffer(const void *)");
  }
  fVar10 = MyGame_Sample_Vec3_x(t__tmp_00);
  pos_vec.z = MyGame_Sample_Vec3_y(t__tmp_00);
  pos_vec.y = MyGame_Sample_Vec3_z(t__tmp_00);
  if ((fVar10 != 1.0) || (NAN(fVar10))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xf0,"int access_monster_buffer(const void *)");
  }
  if ((pos_vec.z != 2.0) || (NAN(pos_vec.z))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xf1,"int access_monster_buffer(const void *)");
  }
  if ((pos_vec.y != 3.0) || (NAN(pos_vec.y))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xf2,"int access_monster_buffer(const void *)");
  }
  MyGame_Sample_Vec3_copy_from_pe((MyGame_Sample_Vec3_t *)&inv,t__tmp_00);
  if ((inv._0_4_ != 1.0) || (NAN(inv._0_4_))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xfa,"int access_monster_buffer(const void *)");
  }
  if ((inv._4_4_ != 2.0) || (NAN(inv._4_4_))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xfb,"int access_monster_buffer(const void *)");
  }
  if ((pos_vec.x != 3.0) || (NAN(pos_vec.x))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xfc,"int access_monster_buffer(const void *)");
  }
  vec__tmp = MyGame_Sample_Monster_inventory(t__tmp);
  sVar8 = flatbuffers_uint8_vec_len(vec__tmp);
  if (vec__tmp == (flatbuffers_uint8_vec_t)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0x105,"int access_monster_buffer(const void *)");
  }
  if (sVar8 != 10) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0x107,"int access_monster_buffer(const void *)");
  }
  uVar1 = flatbuffers_uint8_vec_at(vec__tmp,2);
  if (uVar1 != '\x02') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0x10b,"int access_monster_buffer(const void *)");
  }
  vec = MyGame_Sample_Monster_weapons(t__tmp);
  sVar8 = MyGame_Sample_Weapon_vec_len(vec);
  if (sVar8 == 2) {
    pMVar9 = MyGame_Sample_Weapon_vec_at(vec,1);
    pcVar7 = MyGame_Sample_Weapon_name(pMVar9);
    pMVar9 = MyGame_Sample_Weapon_vec_at(vec,1);
    iVar3 = MyGame_Sample_Weapon_damage(pMVar9);
    if ((pcVar7 == (flatbuffers_string_t)0x0) || (iVar5 = strcmp(pcVar7,"Axe"), iVar5 != 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0x113,"int access_monster_buffer(const void *)");
    }
    if (iVar3 != 5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0x114,"int access_monster_buffer(const void *)");
    }
    MVar2 = MyGame_Sample_Monster_equipped_type(t__tmp);
    if (MVar2 == '\x01') {
      pMVar9 = (MyGame_Sample_Weapon_table_t)MyGame_Sample_Monster_equipped(t__tmp);
      pcVar7 = MyGame_Sample_Weapon_name(pMVar9);
      iVar3 = MyGame_Sample_Weapon_damage(pMVar9);
      iVar5 = strcmp(pcVar7,"Axe");
      if (iVar5 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                      ,0x11e,"int access_monster_buffer(const void *)");
      }
      if (iVar3 != 5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                      ,0x11f,"int access_monster_buffer(const void *)");
      }
    }
    return 0;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                ,0x10f,"int access_monster_buffer(const void *)");
}

Assistant:

int access_monster_buffer(const void *buffer)
{
    // Note that we use the `table_t` suffix when reading a table object
    // as opposed to the `ref_t` suffix used during the construction of
    // the buffer.
    ns(Monster_table_t) monster = ns(Monster_as_root(buffer));

    // Note: root object pointers are NOT the same as the `buffer` pointer.

    // Make sure the buffer is accessible.
    test_assert(monster != 0);

    int16_t hp = ns(Monster_hp(monster));
    int16_t mana = ns(Monster_mana(monster));
    // This is just a const char *, but it also supports a fast length operation.
    flatbuffers_string_t name = ns(Monster_name(monster));
    size_t name_len = flatbuffers_string_len(name);

    test_assert(hp == 300);
    // Since 150 is the default, we are reading a value that wasn't stored.
    test_assert(mana == 150);
    test_assert(0 == strcmp(name, "Orc"));
    test_assert(name_len == strlen("Orc"));

    int hp_present = ns(Monster_hp_is_present(monster)); // 1
    int mana_present = ns(Monster_mana_is_present(monster)); // 0
    test_assert(hp_present);
    test_assert(!mana_present);

    ns(Vec3_struct_t) pos = ns(Monster_pos(monster));
    // Make sure pos has been set.
    test_assert(pos != 0);
    float x = ns(Vec3_x(pos));
    float y = ns(Vec3_y(pos));
    float z = ns(Vec3_z(pos));

    // The literal `f` suffix is important because double literals does
    // not always map cleanly to 32-bit represention even with only a few digits:
    // `1.0 == 1.0f`, but `3.2 != 3.2f`.
    test_assert(x == 1.0f);
    test_assert(y == 2.0f);
    test_assert(z == 3.0f);

    // We can also read the position into a C-struct. We have to copy
    // because we generally do not know if the native endian format
    // matches the one stored in the buffer (pe: protocol endian).
    ns(Vec3_t) pos_vec;
    // `pe` indicates endian conversion from protocol to native.
    ns(Vec3_copy_from_pe(&pos_vec, pos));
    test_assert(pos_vec.x == 1.0f);
    test_assert(pos_vec.y == 2.0f);
    test_assert(pos_vec.z == 3.0f);

    // This is a const uint8_t *, but it shouldn't be accessed directly
    // to ensure proper endian conversion. However, uint8 (ubyte) are
    // not sensitive endianness, so we *could* have accessed it directly.
    // The compiler likely optimizes this so that it doesn't matter.
    flatbuffers_uint8_vec_t inv = ns(Monster_inventory(monster));
    size_t inv_len = flatbuffers_uint8_vec_len(inv);
    // Make sure the inventory has been set.
    test_assert(inv != 0);
    // If `inv` were absent, the length would 0, so the above test is redundant.
    test_assert(inv_len == 10);
    // Index 0 is the first, index 2 is the third.
    // NOTE: C++ uses the `Get` terminology for vector elemetns, C use `at`.
    uint8_t third_item = flatbuffers_uint8_vec_at(inv, 2);
    test_assert(third_item == 2);

    ns(Weapon_vec_t) weapons = ns(Monster_weapons(monster));
    size_t weapons_len = ns(Weapon_vec_len(weapons));
    test_assert(weapons_len == 2);
    // We can use `const char *` instead of `flatbuffers_string_t`.
    const char *second_weapon_name = ns(Weapon_name(ns(Weapon_vec_at(weapons, 1))));
    int16_t second_weapon_damage =  ns(Weapon_damage(ns(Weapon_vec_at(weapons, 1))));
    test_assert(second_weapon_name != 0 && strcmp(second_weapon_name, "Axe") == 0);
    test_assert(second_weapon_damage == 5);

    // Access union type field.
    if (ns(Monster_equipped_type(monster)) == ns(Equipment_Weapon)) {
        // Cast to appropriate type:
        // C does not require the cast to Weapon_table_t, but C++ does.
        ns(Weapon_table_t) weapon = (ns(Weapon_table_t)) ns(Monster_equipped(monster));
        const char *weapon_name = ns(Weapon_name(weapon));
        int16_t weapon_damage = ns(Weapon_damage(weapon));

        test_assert(0 == strcmp(weapon_name, "Axe"));
        test_assert(weapon_damage == 5);
    }
    return 0;
}